

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3UnlinkAndDeleteTable(sqlite3 *db,int iDb,char *zTabName)

{
  Table *pTable;
  Db *pDb;
  Table *p;
  char *zTabName_local;
  int iDb_local;
  sqlite3 *db_local;
  
  pTable = (Table *)sqlite3HashInsert(&(db->aDb[iDb].pSchema)->tblHash,zTabName,(void *)0x0);
  sqlite3DeleteTable(db,pTable);
  db->mDbFlags = db->mDbFlags | 1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UnlinkAndDeleteTable(sqlite3 *db, int iDb, const char *zTabName){
  Table *p;
  Db *pDb;

  assert( db!=0 );
  assert( iDb>=0 && iDb<db->nDb );
  assert( zTabName );
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  testcase( zTabName[0]==0 );  /* Zero-length table names are allowed */
  pDb = &db->aDb[iDb];
  p = sqlite3HashInsert(&pDb->pSchema->tblHash, zTabName, 0);
  sqlite3DeleteTable(db, p);
  db->mDbFlags |= DBFLAG_SchemaChange;
}